

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

string * __thiscall
pbrt::syntactic::ParamArray<float>::toString_abi_cxx11_
          (string *__return_storage_ptr__,ParamArray<float> *this)

{
  pointer pfVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  stringstream ss;
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  (**(this->super_Param)._vptr_Param)(local_1d0,this);
  poVar2 = std::operator<<(local_1a0,local_1d0);
  std::operator<<(poVar2," ");
  std::__cxx11::string::~string(local_1d0);
  std::operator<<(local_1a0,"[ ");
  for (uVar3 = 0;
      pfVar1 = (this->super_vector<float,_std::allocator<float>_>).
               super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
               _M_start,
      uVar3 < (ulong)((long)(this->super_vector<float,_std::allocator<float>_>).
                            super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pfVar1 >> 2);
      uVar3 = uVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(local_1a0,pfVar1[uVar3]);
    std::operator<<(poVar2," ");
  }
  std::operator<<(local_1a0,"]");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ParamArray<float>::toString() const
    { 
      std::stringstream ss;
      ss << getType() << " ";
      ss << "[ ";
      for (size_t i=0;i<this->size();i++)
        ss << get(i) << " ";
      ss << "]";
      return ss.str();
    }